

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::ImageTest::getGlslSampler_abi_cxx11_
          (string *__return_storage_ptr__,ImageTest *this,TextureFormat *format,VkImageViewType type
          ,VkDescriptorType samplingType,int imageCount)

{
  long *plVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  VkImageViewType type_00;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  string texSampler;
  string texImage;
  char *local_d0;
  size_type local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  string *local_b0 [2];
  string local_a0;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  pcVar5 = "texSampler";
  if (1 < (int)samplingType) {
    pcVar5 = "texSamplers[i]";
  }
  local_d0 = &local_c0;
  pcVar6 = "texImage";
  if (1 < (int)samplingType) {
    pcVar6 = "texImages[i]";
  }
  lVar7 = (ulong)(1 < (int)samplingType) * 4;
  type_00 = type;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar5,pcVar5 + lVar7 + 10);
  local_b0[0] = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar6,pcVar6 + lVar7 + 8);
  if (type == VK_IMAGE_VIEW_TYPE_3D) {
    getGlslSamplerType_abi_cxx11_
              (&local_50,this,(TextureFormat *)((ulong)format & 0xffffffff),type_00);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = plVar1[3];
      local_a0.field_2._M_allocated_capacity = (size_type)&local_80;
    }
    else {
      local_80 = *plVar3;
      local_a0.field_2._M_allocated_capacity = (size_type)(long *)*plVar1;
    }
    local_a0.field_2._8_8_ = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               (local_a0.field_2._M_local_buf,(ulong)local_b0[0]);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar1;
    }
    local_68 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar4) {
      lVar7 = plVar1[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar1[1];
    *plVar1 = (long)psVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((long *)local_a0.field_2._M_allocated_capacity != &local_80) {
      operator_delete((void *)local_a0.field_2._M_allocated_capacity,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_d0 == &local_c0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_bf,local_c0);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_b8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_bf,local_c0);
    }
    __return_storage_ptr__->_M_string_length = local_c8;
    local_c8 = 0;
    local_c0 = '\0';
    local_d0 = &local_c0;
  }
  psVar2 = &local_a0;
  if (local_b0[0] != psVar2) {
    operator_delete(local_b0[0],(ulong)(local_a0._M_dataplus._M_p + 1));
    psVar2 = extraout_RAX;
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    psVar2 = extraout_RAX_00;
  }
  return psVar2;
}

Assistant:

std::string ImageTest::getGlslSampler (const tcu::TextureFormat& format, VkImageViewType type, VkDescriptorType samplingType, int imageCount)
{
	std::string texSampler	= imageCount > 1 ? "texSamplers[i]" : "texSampler";
	std::string texImage	= imageCount > 1 ? "texImages[i]" : "texImage";

	switch (samplingType)
	{
		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
			return getGlslSamplerType(format, type) + "(" + texImage + ", texSampler)";
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
		default:
			return texSampler;
	}
}